

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

int __thiscall httplib::Server::bind_internal(Server *this,string *host,int port,int socket_flags)

{
  uint16_t uVar1;
  __int_type _Var2;
  int iVar3;
  ulong uVar4;
  undefined4 in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  socklen_t addr_len;
  sockaddr_storage addr;
  uint uVar5;
  socklen_t local_d4;
  sockaddr local_d0 [6];
  SocketOptions *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  Server *in_stack_ffffffffffffffb0;
  function<void_(int)> local_40;
  undefined4 local_20;
  uint local_1c;
  __int_type _Stack_14;
  uint local_4;
  
  _Stack_14 = (__int_type)((ulong)in_RSI >> 0x20);
  local_20 = in_ECX;
  local_1c = in_EDX;
  uVar4 = (**(code **)(*in_RDI + 0x10))();
  if ((uVar4 & 1) == 0) {
    local_4 = 0xffffffff;
  }
  else {
    uVar5 = local_1c;
    _Var2 = _Stack_14;
    std::function<void_(int)>::function
              (&local_40,(function<void_(int)> *)CONCAT44(local_20,local_1c));
    create_server_socket
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::__atomic_base<int>::operator=((__atomic_base<int> *)CONCAT44(local_20,uVar5),_Var2);
    std::function<void_(int)>::~function((function<void_(int)> *)0x19b63e);
    _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)CONCAT44(local_20,uVar5))
    ;
    if (_Var2 == -1) {
      local_4 = 0xffffffff;
    }
    else if (local_1c == 0) {
      local_d4 = 0x80;
      _Var2 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)CONCAT44(local_20,uVar5));
      iVar3 = getsockname(_Var2,local_d0,&local_d4);
      if (iVar3 == -1) {
        local_4 = 0xffffffff;
      }
      else if (local_d0[0].sa_family == 2) {
        uVar1 = ntohs(local_d0[0].sa_data._0_2_);
        local_4 = (uint)uVar1;
      }
      else if (local_d0[0].sa_family == 10) {
        uVar1 = ntohs(local_d0[0].sa_data._0_2_);
        local_4 = (uint)uVar1;
      }
      else {
        local_4 = 0xffffffff;
      }
    }
    else {
      local_4 = local_1c;
    }
  }
  return local_4;
}

Assistant:

inline int Server::bind_internal(const std::string &host, int port,
                                 int socket_flags) {
  if (!is_valid()) { return -1; }

  svr_sock_ = create_server_socket(host, port, socket_flags, socket_options_);
  if (svr_sock_ == INVALID_SOCKET) { return -1; }

  if (port == 0) {
    struct sockaddr_storage addr;
    socklen_t addr_len = sizeof(addr);
    if (getsockname(svr_sock_, reinterpret_cast<struct sockaddr *>(&addr),
                    &addr_len) == -1) {
      return -1;
    }
    if (addr.ss_family == AF_INET) {
      return ntohs(reinterpret_cast<struct sockaddr_in *>(&addr)->sin_port);
    } else if (addr.ss_family == AF_INET6) {
      return ntohs(reinterpret_cast<struct sockaddr_in6 *>(&addr)->sin6_port);
    } else {
      return -1;
    }
  } else {
    return port;
  }
}